

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_t.cpp
# Opt level: O2

stack_t * __thiscall deci::stack_t::operator=(stack_t *this,stack_t *move)

{
  if (this != move) {
    std::vector<deci::value_t_*,_std::allocator<deci::value_t_*>_>::_M_move_assign(&this->storage);
    dictionary_t::operator=(&this->context,&move->context);
  }
  return this;
}

Assistant:

stack_t& stack_t::operator = (stack_t&& move) {
    if (this != &move) {
      this->storage = std::move(move.storage);
      this->context = std::move(move.context);
    }
    return *this;
  }